

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O3

char * Abc_NodeConvertSopToMvSop(int nVars,Vec_Int_t *vSop0,Vec_Int_t *vSop1)

{
  int iVar1;
  uint uVar2;
  ulong __n;
  char *__s;
  char *pcVar3;
  byte bVar4;
  long lVar5;
  int iVar6;
  char *__size;
  uint uVar7;
  char cVar9;
  ulong uVar8;
  
  __n = (ulong)(uint)nVars;
  iVar1 = vSop0->nSize;
  if ((iVar1 == 0) || (iVar6 = vSop1->nSize, iVar6 == 0)) {
    __s = (char *)malloc((long)(nVars + 3));
    if (0 < nVars) {
      memset(__s,0x2d,__n);
    }
    __s[nVars] = 0 < vSop1->nSize | 0x30;
    (__s + (long)nVars + 1)[0] = '\n';
    (__s + (long)nVars + 1)[1] = '\0';
  }
  else {
    __size = (char *)(long)((nVars + 2) * (iVar1 + iVar6) + 1);
    __s = (char *)malloc((size_t)__size);
    pcVar3 = __s;
    if (0 < iVar1) {
      lVar5 = 0;
      do {
        if (0 < nVars) {
          uVar2 = vSop0->pArray[lVar5];
          bVar4 = 0;
          uVar8 = __n;
          do {
            switch(uVar2 >> (bVar4 & 0x1f) & 3) {
            case 0:
              cVar9 = '-';
              break;
            case 1:
              cVar9 = '0';
              break;
            case 2:
              cVar9 = '1';
              break;
            case 3:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcBlifMv.c"
                            ,0x42f,"char *Abc_NodeConvertSopToMvSop(int, Vec_Int_t *, Vec_Int_t *)")
              ;
            }
            *pcVar3 = cVar9;
            pcVar3 = pcVar3 + 1;
            bVar4 = bVar4 + 2;
            uVar7 = (int)uVar8 - 1;
            uVar8 = (ulong)uVar7;
          } while (uVar7 != 0);
        }
        pcVar3[0] = '0';
        pcVar3[1] = '\n';
        pcVar3 = pcVar3 + 2;
        lVar5 = lVar5 + 1;
      } while (lVar5 < vSop0->nSize);
      iVar6 = vSop1->nSize;
    }
    if (0 < iVar6) {
      lVar5 = 0;
      do {
        if (0 < nVars) {
          uVar2 = vSop1->pArray[lVar5];
          bVar4 = 0;
          uVar8 = __n;
          do {
            switch(uVar2 >> (bVar4 & 0x1f) & 3) {
            case 0:
              cVar9 = '-';
              break;
            case 1:
              cVar9 = '0';
              break;
            case 2:
              cVar9 = '1';
              break;
            case 3:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcBlifMv.c"
                            ,0x441,"char *Abc_NodeConvertSopToMvSop(int, Vec_Int_t *, Vec_Int_t *)")
              ;
            }
            *pcVar3 = cVar9;
            pcVar3 = pcVar3 + 1;
            bVar4 = bVar4 + 2;
            uVar7 = (int)uVar8 - 1;
            uVar8 = (ulong)uVar7;
          } while (uVar7 != 0);
        }
        pcVar3[0] = '1';
        pcVar3[1] = '\n';
        pcVar3 = pcVar3 + 2;
        lVar5 = lVar5 + 1;
      } while (lVar5 < vSop1->nSize);
    }
    *pcVar3 = '\0';
    if (pcVar3 + (1 - (long)__s) != __size) {
      __assert_fail("pCur - pMvSop == nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcBlifMv.c"
                    ,0x447,"char *Abc_NodeConvertSopToMvSop(int, Vec_Int_t *, Vec_Int_t *)");
    }
  }
  return __s;
}

Assistant:

char * Abc_NodeConvertSopToMvSop( int nVars, Vec_Int_t * vSop0, Vec_Int_t * vSop1 )
{
    char * pMvSop, * pCur;
    unsigned uCube;
    int nCubes, nSize, Value, i, k;
    // consider the case of the constant node
    if ( Vec_IntSize(vSop0) == 0 || Vec_IntSize(vSop1) == 0 )
    {
        // (temporary) create a tautology cube
        pMvSop = ABC_ALLOC( char, nVars + 3 );
        for ( k = 0; k < nVars; k++ )
            pMvSop[k] = '-';
        pMvSop[nVars] = '0' + (int)(Vec_IntSize(vSop1) > 0);
        pMvSop[nVars+1] = '\n';
        pMvSop[nVars+2] = 0;
        return pMvSop;
    }
    // find the total number of cubes
    nCubes = Vec_IntSize(vSop0) + Vec_IntSize(vSop1);
    // find the size of the MVSOP represented as a C-string
    // (each cube has nVars variables + one output literal + end-of-line,
    // and the string is zero-terminated)
    nSize = nCubes * (nVars + 2) + 1; 
    // allocate memory
    pMvSop = pCur = ABC_ALLOC( char, nSize );
    // fill in the negative polarity cubes
    Vec_IntForEachEntry( vSop0, uCube, i )
    {
        for ( k = 0; k < nVars; k++ )
        {
            Value = (uCube >> (2*k)) & 3;
            if ( Value == 1 )
                *pCur++ = '0';
            else if ( Value == 2 )
                *pCur++ = '1';
            else if ( Value == 0 )
                *pCur++ = '-';
            else
                assert( 0 );
        }
        *pCur++ = '0';
        *pCur++ = '\n';
    }
    // fill in the positive polarity cubes
    Vec_IntForEachEntry( vSop1, uCube, i )
    {
        for ( k = 0; k < nVars; k++ )
        {
            Value = (uCube >> (2*k)) & 3;
            if ( Value == 1 )
                *pCur++ = '0';
            else if ( Value == 2 )
                *pCur++ = '1';
            else if ( Value == 0 )
                *pCur++ = '-';
            else
                assert( 0 );
        }
        *pCur++ = '1';
        *pCur++ = '\n';
    }
    *pCur++ = 0;
    assert( pCur - pMvSop == nSize );
    return pMvSop;
}